

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSession::Create
          (RTPSession *this,RTPSessionParams *sessparams,RTPTransmissionParams *transparams,
          TransmissionProtocol protocol)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  RTPTransmitter *pRVar4;
  RTPMemoryManager *pRVar5;
  int iVar6;
  undefined4 extraout_var;
  RTPUDPv6Transmitter *this_00;
  
  if (this->created != false) {
    return -0x3a;
  }
  bVar1 = sessparams->usepollthread;
  this->usingpollthread = bVar1;
  bVar2 = sessparams->m_needThreadSafety;
  this->needthreadsafety = bVar2;
  if ((byte)(bVar1 ^ 1U | bVar2) != 1) {
    return -0xb1;
  }
  this->useSR_BYEifpossible = sessparams->SR_BYE;
  this->sentpackets = false;
  uVar3 = sessparams->maxpacksize;
  this->maxpacksize = uVar3;
  if (uVar3 < 600) {
    return -0x3d;
  }
  this->rtptrans = (RTPTransmitter *)0x0;
  switch(protocol) {
  case IPv4UDPProto:
    pRVar5 = (this->super_RTPMemoryObject).mgr;
    if (pRVar5 == (RTPMemoryManager *)0x0) {
      this_00 = (RTPUDPv6Transmitter *)operator_new(0x30ce0);
    }
    else {
      this_00 = (RTPUDPv6Transmitter *)(**(code **)(*(long *)pRVar5 + 0x10))(pRVar5,0x30ce0,0x1d);
    }
    RTPUDPv4Transmitter::RTPUDPv4Transmitter
              ((RTPUDPv4Transmitter *)this_00,(this->super_RTPMemoryObject).mgr);
    break;
  case IPv6UDPProto:
    pRVar5 = (this->super_RTPMemoryObject).mgr;
    if (pRVar5 == (RTPMemoryManager *)0x0) {
      this_00 = (RTPUDPv6Transmitter *)operator_new(0x30ce8);
    }
    else {
      this_00 = (RTPUDPv6Transmitter *)(**(code **)(*(long *)pRVar5 + 0x10))(pRVar5,0x30ce8,0x1d);
    }
    RTPUDPv6Transmitter::RTPUDPv6Transmitter(this_00,(this->super_RTPMemoryObject).mgr);
    break;
  case TCPProto:
    pRVar5 = (this->super_RTPMemoryObject).mgr;
    if (pRVar5 == (RTPMemoryManager *)0x0) {
      this_00 = (RTPUDPv6Transmitter *)operator_new(200);
    }
    else {
      this_00 = (RTPUDPv6Transmitter *)(**(code **)(*(long *)pRVar5 + 0x10))(pRVar5,200,0x1d);
    }
    RTPTCPTransmitter::RTPTCPTransmitter
              ((RTPTCPTransmitter *)this_00,(this->super_RTPMemoryObject).mgr);
    break;
  case ExternalProto:
    pRVar5 = (this->super_RTPMemoryObject).mgr;
    if (pRVar5 == (RTPMemoryManager *)0x0) {
      this_00 = (RTPUDPv6Transmitter *)operator_new(0x70);
    }
    else {
      this_00 = (RTPUDPv6Transmitter *)(**(code **)(*(long *)pRVar5 + 0x10))(pRVar5,0x70,0x1d);
    }
    RTPExternalTransmitter::RTPExternalTransmitter
              ((RTPExternalTransmitter *)this_00,(this->super_RTPMemoryObject).mgr);
    break;
  case UserDefinedProto:
    iVar6 = (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[2])(this);
    this->rtptrans = (RTPTransmitter *)CONCAT44(extraout_var,iVar6);
    if ((RTPTransmitter *)CONCAT44(extraout_var,iVar6) == (RTPTransmitter *)0x0) {
      return -0x77;
    }
    goto LAB_0012516f;
  default:
    return -0x3f;
  }
  this->rtptrans = &this_00->super_RTPTransmitter;
LAB_0012516f:
  pRVar4 = this->rtptrans;
  if (pRVar4 == (RTPTransmitter *)0x0) {
    iVar6 = -1;
  }
  else {
    iVar6 = (*(pRVar4->super_RTPMemoryObject)._vptr_RTPMemoryObject[2])
                      (pRVar4,(ulong)this->needthreadsafety);
    pRVar4 = this->rtptrans;
    if (iVar6 < 0) {
      pRVar5 = (this->super_RTPMemoryObject).mgr;
      if (pRVar5 == (RTPMemoryManager *)0x0) {
        if (pRVar4 != (RTPTransmitter *)0x0) {
          (*(pRVar4->super_RTPMemoryObject)._vptr_RTPMemoryObject[1])(pRVar4);
        }
      }
      else {
        (**(pRVar4->super_RTPMemoryObject)._vptr_RTPMemoryObject)(pRVar4);
        (**(code **)(*(long *)pRVar5 + 0x18))(pRVar5,pRVar4);
      }
    }
    else {
      iVar6 = (*(pRVar4->super_RTPMemoryObject)._vptr_RTPMemoryObject[3])
                        (pRVar4,this->maxpacksize,transparams);
      if (-1 < iVar6) {
        this->deletetransmitter = true;
        iVar6 = InternalCreate(this,sessparams);
        return iVar6;
      }
      RTPDelete<jrtplib::RTPTransmitter>(this->rtptrans,(this->super_RTPMemoryObject).mgr);
    }
  }
  return iVar6;
}

Assistant:

int RTPSession::Create(const RTPSessionParams &sessparams,const RTPTransmissionParams *transparams /* = 0 */,
		       RTPTransmitter::TransmissionProtocol protocol)
{
	int status;
	
	if (created)
		return ERR_RTP_SESSION_ALREADYCREATED;

	usingpollthread = sessparams.IsUsingPollThread();
	needthreadsafety = sessparams.NeedThreadSafety();
	if (usingpollthread && !needthreadsafety)
		return ERR_RTP_SESSION_THREADSAFETYCONFLICT;

	useSR_BYEifpossible = sessparams.GetSenderReportForBYE();
	sentpackets = false;
	
	// Check max packet size
	
	if ((maxpacksize = sessparams.GetMaximumPacketSize()) < RTP_MINPACKETSIZE)
		return ERR_RTP_SESSION_MAXPACKETSIZETOOSMALL;
		
	// Initialize the transmission component
	
	rtptrans = 0;
	switch(protocol)
	{
	case RTPTransmitter::IPv4UDPProto:
		rtptrans = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMITTER) RTPUDPv4Transmitter(GetMemoryManager());
		break;
#ifdef RTP_SUPPORT_IPV6
	case RTPTransmitter::IPv6UDPProto:
		rtptrans = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMITTER) RTPUDPv6Transmitter(GetMemoryManager());
		break;
#endif // RTP_SUPPORT_IPV6
	case RTPTransmitter::ExternalProto:
		rtptrans = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMITTER) RTPExternalTransmitter(GetMemoryManager());
		break;
	case RTPTransmitter::UserDefinedProto:
		rtptrans = NewUserDefinedTransmitter();
		if (rtptrans == 0)
			return ERR_RTP_SESSION_USERDEFINEDTRANSMITTERNULL;
		break;
	case RTPTransmitter::TCPProto:
		rtptrans = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMITTER) RTPTCPTransmitter(GetMemoryManager());
		break;
	default:
		return ERR_RTP_SESSION_UNSUPPORTEDTRANSMISSIONPROTOCOL;
	}
	
	if (rtptrans == 0)
		return ERR_RTP_OUTOFMEM;
	if ((status = rtptrans->Init(needthreadsafety)) < 0)
	{
		RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}
	if ((status = rtptrans->Create(maxpacksize,transparams)) < 0)
	{
		RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	deletetransmitter = true;
	return InternalCreate(sessparams);
}